

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImGuiNavMoveResult *pIVar2;
  bool *pbVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImGuiID *pIVar6;
  ImVec2 *pIVar7;
  float *pfVar8;
  float fVar9;
  ImVec2 IVar10;
  ImGuiID IVar11;
  ImGuiInputSource IVar12;
  ImGuiID IVar13;
  ImGuiContextHook *pIVar14;
  ImFontAtlas *pIVar15;
  uint *puVar16;
  ImGuiViewportP *pIVar17;
  ImGuiWindow **ppIVar18;
  ImGuiPopupData *pIVar19;
  int *piVar20;
  ImGuiGroupData *pIVar21;
  ImRect IVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  ImGuiContext *pIVar32;
  ImGuiContext *pIVar33;
  ImGuiContext *pIVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  int iVar39;
  uint uVar40;
  ImGuiContext *g_4;
  uint *__dest;
  ImGuiWindow *pIVar41;
  ulong uVar42;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar43;
  ImGuiGroupData *__dest_02;
  int i;
  uint uVar44;
  ImGuiWindow *window;
  char *pcVar45;
  ImGuiWindow *parent;
  long lVar46;
  ImGuiWindow *pIVar47;
  ImGuiContext *g;
  byte bVar48;
  int iVar49;
  ImRect *pIVar50;
  byte bVar51;
  ImGuiNavLayer IVar52;
  ImFont *font;
  ImGuiContext *g_1;
  ImGuiContext *g_3;
  ImGuiNavMoveResult *pIVar53;
  byte bVar54;
  ImGuiContext *g_6;
  long lVar55;
  ImGuiWindow *old_nav_window;
  long lVar56;
  long lVar57;
  ImGuiContext *pIVar58;
  ulong uVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined8 uVar63;
  undefined8 uVar89;
  ImVec4 IVar66;
  undefined1 auVar67 [16];
  ImVec2 IVar64;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar65;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar118;
  float local_68;
  ImRect local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pIVar32 = GImGui;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf01,"void ImGui::NewFrame()");
  }
  lVar55 = (long)(GImGui->Hooks).Size;
  if (0 < lVar55) {
    lVar56 = -lVar55;
    lVar57 = lVar55 << 5;
    do {
      lVar46 = (long)(pIVar32->Hooks).Size;
      if (lVar46 < lVar55) {
        pcVar45 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_001549d6;
      }
      pIVar14 = (pIVar32->Hooks).Data;
      if (*(int *)(pIVar14 + lVar57 + -0x1c) == 7) {
        memmove(pIVar14 + lVar57 + -0x20,pIVar14 + lVar57,(lVar46 + lVar56) * 0x20);
        (pIVar32->Hooks).Size = (pIVar32->Hooks).Size + -1;
      }
      lVar56 = lVar56 + 1;
      bVar35 = 1 < lVar55;
      lVar55 = lVar55 + -1;
      lVar57 = lVar57 + -0x20;
    } while (bVar35);
  }
  if (0 < (pIVar32->Hooks).Size) {
    lVar55 = 0;
    lVar57 = 0;
    do {
      pIVar14 = (pIVar32->Hooks).Data;
      if (*(int *)(pIVar14 + lVar55 + 4) == 0) {
        (**(code **)(pIVar14 + lVar55 + 0x10))(pIVar32);
      }
      lVar57 = lVar57 + 1;
      lVar55 = lVar55 + 0x20;
    } while (lVar57 < (pIVar32->Hooks).Size);
  }
  pIVar33 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar15 = (GImGui->IO).Fonts;
  if ((pIVar15->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar15->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar60 = (GImGui->Style).Alpha;
  if ((fVar60 < 0.0) || (1.0 < fVar60)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar55 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar55] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar33->SettingsLoaded == false) {
    if ((pIVar33->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x27b3,"void ImGui::UpdateSettings()");
    }
    pcVar45 = (pIVar33->IO).IniFilename;
    if (pcVar45 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar45);
    }
    pIVar33->SettingsLoaded = true;
  }
  if ((0.0 < pIVar33->SettingsDirtyTimer) &&
     (fVar60 = pIVar33->SettingsDirtyTimer - (pIVar33->IO).DeltaTime,
     pIVar33->SettingsDirtyTimer = fVar60, fVar60 <= 0.0)) {
    pcVar45 = (pIVar33->IO).IniFilename;
    if (pcVar45 == (char *)0x0) {
      (pIVar33->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar45);
    }
    pIVar33->SettingsDirtyTimer = 0.0;
  }
  pIVar32->Time = (double)(pIVar32->IO).DeltaTime + pIVar32->Time;
  pIVar32->WithinFrameScope = true;
  pIVar32->FrameCount = pIVar32->FrameCount + 1;
  uVar42 = 0;
  pIVar32->TooltipOverrideCount = 0;
  pIVar32->WindowsActiveCount = 0;
  iVar49 = (pIVar32->MenusIdSubmittedThisFrame).Capacity;
  if (iVar49 < 0) {
    uVar44 = iVar49 / 2 + iVar49;
    if (0 < (int)uVar44) {
      uVar42 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(uVar42 * 4,GImAllocatorUserData);
    puVar16 = (pIVar32->MenusIdSubmittedThisFrame).Data;
    if (puVar16 != (uint *)0x0) {
      memcpy(__dest,puVar16,(long)(pIVar32->MenusIdSubmittedThisFrame).Size << 2);
      puVar16 = (pIVar32->MenusIdSubmittedThisFrame).Data;
      if ((puVar16 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar16,GImAllocatorUserData);
    }
    (pIVar32->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar32->MenusIdSubmittedThisFrame).Capacity = (int)uVar42;
  }
  (pIVar32->MenusIdSubmittedThisFrame).Size = 0;
  fVar60 = (pIVar32->IO).DeltaTime;
  iVar49 = pIVar32->FramerateSecPerFrameIdx;
  pIVar32->FramerateSecPerFrameAccum =
       (fVar60 - pIVar32->FramerateSecPerFrame[iVar49]) + pIVar32->FramerateSecPerFrameAccum;
  pIVar32->FramerateSecPerFrame[iVar49] = fVar60;
  iVar39 = iVar49 + (int)((ulong)((long)(iVar49 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar32->FramerateSecPerFrameIdx = iVar49 + 1 + ((iVar39 >> 6) - (iVar39 >> 0x1f)) * -0x78;
  auVar68._0_12_ = ZEXT812(0);
  auVar68._12_4_ = 0;
  auVar68 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar32->FramerateSecPerFrameAccum),1);
  auVar81._8_4_ = 0x7f7fffff;
  auVar81._0_8_ = 0x7f7fffff7f7fffff;
  auVar81._12_4_ = 0x7f7fffff;
  auVar68 = vblendvps_avx(auVar81,ZEXT416((uint)(1.0 / (pIVar32->FramerateSecPerFrameAccum / 120.0))
                                         ),auVar68);
  (pIVar32->IO).Framerate = auVar68._0_4_;
  pIVar33 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x28e2,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar17 = *(GImGui->Viewports).Data;
  (pIVar17->super_ImGuiViewport).Flags = 5;
  (pIVar17->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar17->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar17->super_ImGuiViewport).Size = (pIVar33->IO).DisplaySize;
  if (0 < (pIVar33->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar17 = (pIVar33->Viewports).Data[lVar55];
      pIVar17->WorkOffsetMin = pIVar17->CurrWorkOffsetMin;
      pIVar17->WorkOffsetMax = pIVar17->CurrWorkOffsetMax;
      uVar63 = SUB168(ZEXT816(0) << 0x20,0);
      uVar89 = SUB168(ZEXT816(0) << 0x20,8);
      (pIVar17->CurrWorkOffsetMin).x = (float)(int)uVar63;
      (pIVar17->CurrWorkOffsetMin).y = (float)(int)((ulong)uVar63 >> 0x20);
      (pIVar17->CurrWorkOffsetMax).x = (float)(int)uVar89;
      (pIVar17->CurrWorkOffsetMax).y = (float)(int)((ulong)uVar89 >> 0x20);
      ImGuiViewportP::UpdateWorkRect(pIVar17);
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar33->Viewports).Size);
  }
  ((pIVar32->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar15 = (GImGui->IO).Fonts;
    if ((pIVar15->Fonts).Size < 1) {
      pcVar45 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001549d6:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66a,pcVar45);
    }
    font = *(pIVar15->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar32->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf24,"void ImGui::NewFrame()");
  }
  lVar55 = (long)(pIVar32->Viewports).Size;
  IVar66 = _DAT_001e4c30;
  if (0 < lVar55) {
    lVar57 = 0;
    do {
      pIVar17 = (pIVar32->Viewports).Data[lVar57];
      IVar64 = (pIVar17->super_ImGuiViewport).Pos;
      auVar99._8_8_ = 0;
      auVar99._0_4_ = IVar64.x;
      auVar99._4_4_ = IVar64.y;
      IVar10 = (pIVar17->super_ImGuiViewport).Size;
      auVar110._0_4_ = IVar64.x + IVar10.x;
      auVar110._4_4_ = IVar64.y + IVar10.y;
      auVar110._8_8_ = 0;
      auVar99 = vmovlhps_avx(auVar99,auVar110);
      auVar68 = vcmpps_avx(auVar99,(undefined1  [16])IVar66,1);
      auVar81 = vcmpps_avx((undefined1  [16])IVar66,auVar99,1);
      auVar107._0_8_ = auVar68._0_8_;
      auVar107._8_8_ = auVar81._8_8_;
      IVar66 = (ImVec4)vblendvps_avx((undefined1  [16])IVar66,auVar99,auVar107);
      lVar57 = lVar57 + 1;
    } while (lVar55 != lVar57);
  }
  (pIVar32->DrawListSharedData).ClipRectFullscreen = IVar66;
  fVar60 = (pIVar32->Style).CircleTessellationMaxError;
  (pIVar32->DrawListSharedData).CurveTessellationTol = (pIVar32->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar32->DrawListSharedData,fVar60);
  uVar44 = (uint)(pIVar32->Style).AntiAliasedLines;
  (pIVar32->DrawListSharedData).InitialFlags = uVar44;
  if (((pIVar32->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar32->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar32->DrawListSharedData).InitialFlags = uVar44 | 2;
  }
  if ((pIVar32->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar32->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar32->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar32->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (0 < (pIVar32->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar17 = (pIVar32->Viewports).Data[lVar55];
      (pIVar17->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar17->DrawDataP).DisplayPos.x = 0.0;
      (pIVar17->DrawDataP).DisplayPos.y = 0.0;
      (pIVar17->DrawDataP).DisplaySize.x = 0.0;
      (pIVar17->DrawDataP).DisplaySize.y = 0.0;
      (pIVar17->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar17->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar17->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar17->DrawDataP).field_0x1 = 0;
      (pIVar17->DrawDataP).CmdListsCount = 0;
      (pIVar17->DrawDataP).TotalIdxCount = 0;
      (pIVar17->DrawDataP).TotalVtxCount = 0;
      (pIVar17->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar17->DrawDataP).DisplayPos.x = 0.0;
      (pIVar17->DrawDataP).DisplayPos.y = 0.0;
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar32->Viewports).Size);
  }
  pIVar33 = GImGui;
  if ((pIVar32->DragDropActive != false) &&
     (IVar11 = (pIVar32->DragDropPayload).SourceId, IVar11 == pIVar32->ActiveId)) {
    if (GImGui->ActiveId == IVar11) {
      GImGui->ActiveIdIsAlive = IVar11;
    }
    if (pIVar33->ActiveIdPreviousFrame == IVar11) {
      pIVar33->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar32->HoveredIdPreviousFrame == 0) {
    pIVar32->HoveredIdTimer = 0.0;
LAB_00151d07:
    pIVar32->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar32->HoveredId != 0) && (pIVar32->ActiveId == pIVar32->HoveredId))
  goto LAB_00151d07;
  IVar11 = pIVar32->HoveredId;
  if ((IVar11 != 0) &&
     (pIVar32->HoveredIdTimer = (pIVar32->IO).DeltaTime + pIVar32->HoveredIdTimer,
     pIVar32->ActiveId != IVar11)) {
    pIVar32->HoveredIdNotActiveTimer = (pIVar32->IO).DeltaTime + pIVar32->HoveredIdNotActiveTimer;
  }
  pIVar32->HoveredIdPreviousFrame = IVar11;
  pIVar32->HoveredIdPreviousFrameUsingMouseWheel = pIVar32->HoveredIdUsingMouseWheel;
  pIVar32->HoveredId = 0;
  pIVar32->HoveredIdAllowOverlap = false;
  pIVar32->HoveredIdUsingMouseWheel = false;
  pIVar32->HoveredIdDisabled = false;
  IVar11 = pIVar32->ActiveId;
  if (((pIVar32->ActiveIdIsAlive != IVar11) && (IVar11 != 0)) &&
     (pIVar32->ActiveIdPreviousFrame == IVar11)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  IVar11 = pIVar32->ActiveId;
  if (IVar11 != 0) {
    pIVar32->ActiveIdTimer = (pIVar32->IO).DeltaTime + pIVar32->ActiveIdTimer;
  }
  pIVar32->LastActiveIdTimer = (pIVar32->IO).DeltaTime + pIVar32->LastActiveIdTimer;
  pIVar32->ActiveIdPreviousFrame = IVar11;
  pIVar32->ActiveIdPreviousFrameWindow = pIVar32->ActiveIdWindow;
  pIVar32->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar32->ActiveIdHasBeenEditedBefore;
  pIVar32->ActiveIdIsAlive = 0;
  pIVar32->ActiveIdHasBeenEditedThisFrame = false;
  pIVar32->ActiveIdPreviousFrameIsAlive = false;
  pIVar32->ActiveIdIsJustActivated = false;
  if (IVar11 != pIVar32->TempInputId && pIVar32->TempInputId != 0) {
    pIVar32->TempInputId = 0;
  }
  if (IVar11 == 0) {
    pIVar32->ActiveIdUsingNavDirMask = 0;
    pIVar32->ActiveIdUsingNavInputMask = 0;
    pIVar32->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar32->DragDropAcceptIdPrev = pIVar32->DragDropAcceptIdCurr;
  pIVar32->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar32->DragDropAcceptIdCurr = 0;
  pIVar32->DragDropWithinSource = false;
  pIVar32->DragDropWithinTarget = false;
  pIVar32->DragDropHoldJustPressedId = 0;
  pIVar33 = GImGui;
  bVar35 = (GImGui->IO).KeyCtrl;
  uVar44 = bVar35 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar44 = (uint)bVar35;
  }
  uVar40 = uVar44 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar40 = uVar44;
  }
  uVar44 = uVar40 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar44 = uVar40;
  }
  (pIVar32->IO).KeyMods = uVar44;
  memcpy((pIVar32->IO).KeysDownDurationPrev,(pIVar32->IO).KeysDownDuration,0x800);
  lVar55 = 0x144;
  do {
    fVar60 = -1.0;
    if (*(char *)((long)(pIVar32->IO).KeyMap + lVar55 + -0x3c) == '\x01') {
      fVar61 = *(float *)((long)pIVar32 + lVar55 * 4 + -0x70);
      fVar60 = 0.0;
      if (0.0 <= fVar61) {
        fVar60 = fVar61 + (pIVar32->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar32 + lVar55 * 4 + -0x70) = fVar60;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x344);
  (pIVar33->IO).WantSetMousePos = false;
  pIVar33->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar33->NavWrapRequestFlags = 0;
  uVar44 = (pIVar33->IO).ConfigFlags;
  if ((uVar44 & 2) == 0) {
    bVar51 = 0;
  }
  else {
    bVar51 = (byte)(pIVar33->IO).BackendFlags & 1;
  }
  if (((bVar51 != 0) && (pIVar33->NavInputSource != ImGuiInputSource_NavGamepad)) &&
     ((((0.0 < (pIVar33->IO).NavInputs[0] ||
        ((0.0 < (pIVar33->IO).NavInputs[2] || (0.0 < (pIVar33->IO).NavInputs[1])))) ||
       (0.0 < (pIVar33->IO).NavInputs[3])) ||
      ((((0.0 < (pIVar33->IO).NavInputs[4] || (0.0 < (pIVar33->IO).NavInputs[5])) ||
        (0.0 < (pIVar33->IO).NavInputs[6])) || (0.0 < (pIVar33->IO).NavInputs[7])))))) {
    pIVar33->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar44 & 1) != 0) {
    iVar49 = (pIVar33->IO).KeyMap[0xc];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[0] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[0xd];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[2] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[0xe];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[1] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[1];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[0x11] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[2];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[0x12] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[3];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) goto LAB_001549e0;
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[0x13] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar49 = (pIVar33->IO).KeyMap[4];
    if (-1 < (long)iVar49) {
      if (0x1ff < iVar49) {
LAB_001549e0:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x11dd,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar33->IO).KeysDown[iVar49] == true) {
        (pIVar33->IO).NavInputs[0x14] = 1.0;
        pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar35 = (pIVar33->IO).KeyCtrl;
    if (bVar35 == true) {
      (pIVar33->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar33->IO).KeyShift == true) {
      (pIVar33->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar35 == false) && ((pIVar33->IO).KeyAlt != false)) {
      (pIVar33->IO).NavInputs[0x10] = 1.0;
    }
  }
  uVar63 = *(undefined8 *)(pIVar33->IO).NavInputsDownDuration;
  uVar89 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 2);
  uVar23 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 4);
  uVar24 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 6);
  uVar25 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 8);
  uVar26 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 10);
  uVar27 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0xc);
  uVar28 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0xe);
  uVar29 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0xf);
  uVar30 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0x11);
  uVar31 = *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0x13);
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0xd) =
       *(undefined8 *)((pIVar33->IO).NavInputsDownDuration + 0xd);
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0xf) = uVar29;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0x11) = uVar30;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0x13) = uVar31;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 8) = uVar25;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 10) = uVar26;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0xc) = uVar27;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 0xe) = uVar28;
  *(undefined8 *)(pIVar33->IO).NavInputsDownDurationPrev = uVar63;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 2) = uVar89;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 4) = uVar23;
  *(undefined8 *)((pIVar33->IO).NavInputsDownDurationPrev + 6) = uVar24;
  lVar55 = 0;
  do {
    fVar60 = -1.0;
    if (0.0 < (pIVar33->IO).NavInputs[lVar55]) {
      fVar61 = (pIVar33->IO).NavInputsDownDuration[lVar55];
      fVar60 = 0.0;
      if (0.0 <= fVar61) {
        fVar60 = fVar61 + (pIVar33->IO).DeltaTime;
      }
    }
    (pIVar33->IO).NavInputsDownDuration[lVar55] = fVar60;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x15);
  IVar11 = pIVar33->NavInitResultId;
  if (((IVar11 != 0) &&
      ((pIVar33->NavDisableHighlight != true || (pIVar33->NavInitRequestFromMove == true)))) &&
     (pIVar33->NavWindow != (ImGuiWindow *)0x0)) {
    IVar52 = pIVar33->NavLayer;
    if (pIVar33->NavInitRequestFromMove == true) {
      SetNavID(IVar11,IVar52,0);
      IVar64 = (pIVar33->NavInitResultRectRel).Max;
      pIVar7 = &pIVar33->NavWindow->NavRectRel[(int)IVar52].Min;
      *pIVar7 = (pIVar33->NavInitResultRectRel).Min;
      pIVar7[1] = IVar64;
      pIVar33->NavMousePosDirty = true;
      pIVar33->NavDisableHighlight = false;
      pIVar33->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar11,IVar52,0);
    }
    IVar64 = (pIVar33->NavInitResultRectRel).Max;
    pIVar7 = &pIVar33->NavWindow->NavRectRel[pIVar33->NavLayer].Min;
    *pIVar7 = (pIVar33->NavInitResultRectRel).Min;
    pIVar7[1] = IVar64;
  }
  pIVar33->NavInitRequest = false;
  pIVar33->NavInitRequestFromMove = false;
  pIVar33->NavInitResultId = 0;
  pIVar33->NavJustMovedToId = 0;
  pIVar34 = GImGui;
  if (pIVar33->NavMoveRequest == true) {
    IVar11 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar11 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      pIVar58 = GImGui;
      if (GImGui->NavId == 0) goto LAB_0015252c;
    }
    else {
      pIVar2 = &GImGui->NavMoveResultOther;
      pIVar53 = &GImGui->NavMoveResultLocal;
      if (IVar11 == 0) {
        pIVar53 = pIVar2;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar11 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar11 != 0)) &&
         (IVar11 != GImGui->NavId)) {
        pIVar53 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar53 != pIVar2) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar60 = (GImGui->NavMoveResultOther).DistBox;
        fVar61 = pIVar53->DistBox;
        if (fVar61 <= fVar60) {
          if (((fVar60 != fVar61) || (NAN(fVar60) || NAN(fVar61))) ||
             (pIVar53->DistCenter <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_001523f6;
        }
        pIVar53 = pIVar2;
      }
LAB_001523f6:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar41 = pIVar53->Window, pIVar41 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x23fe,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar64 = pIVar53->Window->Pos;
          IVar10 = (pIVar53->RectRel).Min;
          fVar60 = IVar64.x;
          auVar91._0_4_ = IVar10.x + fVar60;
          fVar61 = IVar64.y;
          auVar91._4_4_ = IVar10.y + fVar61;
          auVar91._8_8_ = 0;
          IVar64 = (pIVar53->RectRel).Max;
          auVar67._0_4_ = fVar60 + IVar64.x;
          auVar67._4_4_ = fVar61 + IVar64.y;
          auVar67._8_8_ = 0;
          local_40 = (ImRect)vmovlhps_avx(auVar91,auVar67);
          IVar64 = ScrollToBringRectIntoView(pIVar53->Window,&local_40);
        }
        else {
          fVar60 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar60 = (pIVar41->ScrollMax).y;
          }
          auVar68 = ZEXT416((uint)((pIVar41->Scroll).y - fVar60));
          auVar68 = vinsertps_avx(auVar68,auVar68,0x1d);
          IVar64 = auVar68._0_8_;
          (pIVar41->ScrollTarget).y = fVar60;
          (pIVar41->ScrollTargetCenterRatio).y = 0.0;
          (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        auVar69._8_4_ = IVar64.x;
        auVar69._12_4_ = IVar64.y;
        auVar69._0_4_ = IVar64.x;
        auVar69._4_4_ = IVar64.y;
        IVar22 = (ImRect)vsubps_avx((undefined1  [16])pIVar53->RectRel,auVar69);
        pIVar53->RectRel = IVar22;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar34->NavWindow = pIVar53->Window;
      IVar11 = pIVar53->ID;
      if (pIVar34->NavId != IVar11) {
        pIVar34->NavJustMovedToId = IVar11;
        pIVar34->NavJustMovedToFocusScopeId = pIVar53->FocusScopeId;
        pIVar34->NavJustMovedToKeyMods = pIVar34->NavMoveRequestKeyMods;
      }
      pIVar58 = GImGui;
      IVar52 = pIVar34->NavLayer;
      SetNavID(IVar11,IVar52,pIVar53->FocusScopeId);
      IVar64 = (pIVar53->RectRel).Max;
      pIVar7 = &pIVar58->NavWindow->NavRectRel[(int)IVar52].Min;
      *pIVar7 = (pIVar53->RectRel).Min;
      pIVar7[1] = IVar64;
      pIVar58->NavMousePosDirty = true;
    }
    pIVar58->NavDisableHighlight = false;
    pIVar58->NavDisableMouseHover = true;
  }
LAB_0015252c:
  if (pIVar33->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar33->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x22fa,"void ImGui::NavUpdate()");
    }
    if (((pIVar33->NavMoveResultLocal).ID == 0) && ((pIVar33->NavMoveResultOther).ID == 0)) {
      pIVar33->NavDisableHighlight = false;
    }
    pIVar33->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar33->NavMousePosDirty == true) && (pIVar33->NavIdIsAlive == true)) {
    if (((((pIVar33->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar33->IO).BackendFlags & 4) != 0 && (pIVar33->NavDisableHighlight == false)) &&
         (pIVar33->NavDisableMouseHover == true)))) && (pIVar33->NavWindow != (ImGuiWindow *)0x0)) {
      auVar85._0_8_ = NavCalcPreferredRefPos();
      auVar85._8_56_ = extraout_var;
      IVar64 = (ImVec2)vmovlps_avx(auVar85._0_16_);
      (pIVar33->IO).MousePosPrev = IVar64;
      IVar64 = (ImVec2)vmovlps_avx(auVar85._0_16_);
      (pIVar33->IO).MousePos = IVar64;
      (pIVar33->IO).WantSetMousePos = true;
    }
    pIVar33->NavMousePosDirty = false;
  }
  pIVar33->NavIdIsAlive = false;
  pIVar33->NavJustTabbedId = 0;
  IVar52 = pIVar33->NavLayer;
  if (ImGuiNavLayer_Menu < IVar52) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2310,"void ImGui::NavUpdate()");
  }
  pIVar41 = pIVar33->NavWindow;
  pIVar47 = pIVar41;
  if (pIVar41 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar47->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar47 != pIVar41) {
          pIVar47->NavLastChildNavWindow = pIVar41;
        }
        break;
      }
      ppIVar18 = &pIVar47->ParentWindow;
      pIVar47 = *ppIVar18;
    } while (*ppIVar18 != (ImGuiWindow *)0x0);
    if (((pIVar41 != (ImGuiWindow *)0x0) && (IVar52 == ImGuiNavLayer_Main)) &&
       (pIVar41->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar41->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar34 = GImGui;
  pIVar41 = GetTopMostPopupModal();
  if (pIVar41 != (ImGuiWindow *)0x0) {
    pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar34->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar70._0_12_ = ZEXT812(0);
    auVar70._12_4_ = 0;
    auVar81 = ZEXT416((uint)((pIVar34->IO).DeltaTime * -10.0 + pIVar34->NavWindowingHighlightAlpha))
    ;
    auVar68 = vcmpss_avx(auVar70,auVar81,2);
    auVar68 = vandps_avx(auVar68,auVar81);
    pIVar34->NavWindowingHighlightAlpha = auVar68._0_4_;
    if ((pIVar34->DimBgRatio <= 0.0) && (auVar68._0_4_ <= 0.0)) {
      pIVar34->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar41 == (ImGuiWindow *)0x0) && (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar68 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(pIVar34->IO).NavInputsDownDuration[3]),0)
    ;
    bVar48 = auVar68[0] & 1;
  }
  else {
    bVar48 = 0;
  }
  if ((((pIVar41 == (ImGuiWindow *)0x0) && (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      ((pIVar34->IO).KeyCtrl == true)) &&
     ((iVar49 = (pIVar34->IO).KeyMap[0], -1 < iVar49 && (bVar35 = IsKeyPressed(iVar49,true), bVar35)
      ))) {
    bVar54 = (byte)(pIVar34->IO).ConfigFlags & 1;
  }
  else {
    bVar54 = 0;
  }
  if (bVar48 != 0 || bVar54 != 0) {
    pIVar41 = pIVar34->NavWindow;
    if (pIVar41 == (ImGuiWindow *)0x0) {
      pIVar41 = FindWindowNavFocusable((pIVar34->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar41 != (ImGuiWindow *)0x0) {
      pIVar41 = pIVar41->RootWindow;
      pIVar34->NavWindowingTargetAnim = pIVar41;
      pIVar34->NavWindowingTarget = pIVar41;
      pIVar34->NavWindowingTimer = 0.0;
      pIVar34->NavWindowingHighlightAlpha = 0.0;
      pIVar34->NavWindowingToggleLayer = (bool)(bVar54 ^ 1);
      pIVar34->NavInputSource = ImGuiInputSource_NavGamepad - bVar54;
    }
  }
  fVar60 = (pIVar34->IO).DeltaTime + pIVar34->NavWindowingTimer;
  pIVar34->NavWindowingTimer = fVar60;
  if ((pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar34->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_00152888:
    bVar35 = false;
    pIVar41 = (ImGuiWindow *)0x0;
  }
  else {
    auVar71._0_4_ = (fVar60 + -0.2) / 0.05;
    auVar71._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar81 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar71);
    auVar68 = vcmpss_avx(auVar71,ZEXT816(0) << 0x40,1);
    auVar68 = vandnps_avx(auVar68,auVar81);
    auVar81 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar34->NavWindowingHighlightAlpha),2);
    auVar68 = vblendvps_avx(auVar68,ZEXT416((uint)pIVar34->NavWindowingHighlightAlpha),auVar81);
    pIVar34->NavWindowingHighlightAlpha = auVar68._0_4_;
    fVar60 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar61 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar49 = (uint)(0.0 < fVar60) - (uint)(0.0 < fVar61);
    if (iVar49 != 0) {
      NavUpdateWindowingHighlightWindow(iVar49);
      pIVar34->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00152888;
    pbVar3 = &pIVar34->NavWindowingToggleLayer;
    *pbVar3 = (bool)(*pbVar3 & pIVar34->NavWindowingHighlightAlpha < 1.0);
    if (*pbVar3 == false) {
      pIVar41 = pIVar34->NavWindowingTarget;
      bVar35 = false;
    }
    else {
      bVar35 = pIVar34->NavWindow != (ImGuiWindow *)0x0;
      pIVar41 = (ImGuiWindow *)0x0;
    }
    pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar34->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar34->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    auVar72._0_4_ = (pIVar34->NavWindowingTimer + -0.2) / 0.05;
    auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar81 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar72);
    auVar68 = vcmpss_avx(auVar72,ZEXT816(0) << 0x40,1);
    auVar68 = vandnps_avx(auVar68,auVar81);
    auVar81 = vcmpss_avx(auVar68,ZEXT416((uint)pIVar34->NavWindowingHighlightAlpha),2);
    auVar68 = vblendvps_avx(auVar68,ZEXT416((uint)pIVar34->NavWindowingHighlightAlpha),auVar81);
    pIVar34->NavWindowingHighlightAlpha = auVar68._0_4_;
    iVar49 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar49) && (bVar36 = IsKeyPressed(iVar49,true), bVar36)) {
      NavUpdateWindowingHighlightWindow((pIVar34->IO).KeyShift - 1 | 1);
    }
    if ((pIVar34->IO).KeyCtrl == false) {
      pIVar41 = pIVar34->NavWindowingTarget;
    }
  }
  pIVar58 = GImGui;
  fVar60 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar60 == 0.0) && (!NAN(fVar60))) {
    pIVar34->NavWindowingToggleLayer = true;
  }
  bVar36 = bVar35;
  if ((((pIVar34->ActiveId == 0) || (pIVar34->ActiveIdAllowOverlap == true)) && (fVar60 < 0.0)) &&
     ((pIVar34->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar58->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar37 = IsMousePosValid(&(pIVar34->IO).MousePos);
    bVar38 = IsMousePosValid(&(pIVar34->IO).MousePosPrev);
    bVar36 = true;
    if (bVar38 != bVar37) {
      bVar36 = bVar35;
    }
  }
  pIVar47 = pIVar34->NavWindowingTarget;
  if ((pIVar47 != (ImGuiWindow *)0x0) && ((pIVar47->Flags & 4) == 0)) {
    IVar12 = pIVar34->NavInputSource;
    auVar68 = ZEXT816(0) << 0x40;
    if ((IVar12 == ImGuiInputSource_NavKeyboard) && ((pIVar34->IO).KeyShift == false)) {
      auVar86._0_8_ = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      auVar86._8_56_ = extraout_var_00;
      auVar68 = auVar86._0_16_;
    }
    if (IVar12 == ImGuiInputSource_NavGamepad) {
      auVar87._0_8_ = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      auVar87._8_56_ = extraout_var_01;
      auVar68 = auVar87._0_16_;
    }
    if (auVar68._0_4_ == 0.0) {
      auVar81 = vmovshdup_avx(auVar68);
      if ((auVar81._0_4_ == 0.0) && (!NAN(auVar81._0_4_))) goto LAB_00152ad6;
    }
    auVar81 = vminss_avx(ZEXT416((uint)(pIVar34->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar34->IO).DisplayFramebufferScale.y));
    auVar81 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar34->IO).DeltaTime * 800.0 * auVar81._0_4_)));
    pIVar47 = pIVar47->RootWindow;
    fVar60 = auVar81._0_4_;
    auVar73._0_4_ = (pIVar47->Pos).x + auVar68._0_4_ * fVar60;
    auVar73._4_4_ = (pIVar47->Pos).y + auVar68._4_4_ * fVar60;
    auVar73._8_4_ = auVar68._8_4_ * fVar60 + 0.0;
    auVar73._12_4_ = auVar68._12_4_ * fVar60 + 0.0;
    IVar64 = (ImVec2)vmovlps_avx(auVar73);
    local_40.Min = IVar64;
    SetWindowPos(pIVar47,&local_40.Min,1);
    if (((pIVar47->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
    pIVar34->NavDisableMouseHover = true;
  }
LAB_00152ad6:
  if (pIVar41 != (ImGuiWindow *)0x0) {
    if ((pIVar34->NavWindow == (ImGuiWindow *)0x0) || (pIVar41 != pIVar34->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar34->NavDisableHighlight = false;
      pIVar34->NavDisableMouseHover = true;
      pIVar47 = pIVar41->NavLastChildNavWindow;
      if ((pIVar47 == (ImGuiWindow *)0x0) || (pIVar47->WasActive == false)) {
        pIVar47 = pIVar41;
      }
      ClosePopupsOverWindow(pIVar47,false);
      FocusWindow(pIVar47);
      if (pIVar47->NavLastIds[0] == 0) {
        NavInitWindow(pIVar47,false);
      }
      if ((pIVar47->DC).NavLayerActiveMask == 2) {
        pIVar34->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar36) && (pIVar41 = pIVar34->NavWindow, pIVar47 = pIVar41, pIVar41 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar47, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar47 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar41) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar41;
    }
    pIVar34->NavDisableHighlight = false;
    pIVar34->NavDisableMouseHover = true;
    IVar52 = ImGuiNavLayer_Main;
    if (((pIVar34->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
      IVar52 = pIVar34->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar52);
  }
  if ((((uVar44 & 1) == 0 & (bVar51 ^ 1)) == 0) && (pIVar33->NavWindow != (ImGuiWindow *)0x0)) {
    bVar35 = (pIVar33->NavWindow->Flags & 0x40000U) == 0;
    (pIVar33->IO).NavActive = bVar35;
    if (((!bVar35) || (pIVar33->NavId == 0)) ||
       (bVar35 = true, pIVar33->NavDisableHighlight != false)) goto LAB_00152c4b;
  }
  else {
    (pIVar33->IO).NavActive = false;
LAB_00152c4b:
    bVar35 = pIVar33->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar33->IO).NavVisible = bVar35;
  fVar60 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar60 == 0.0) && (!NAN(fVar60))) {
    if (pIVar33->ActiveId == 0) {
      pIVar41 = pIVar33->NavWindow;
      if (((pIVar41 == (ImGuiWindow *)0x0) || ((pIVar41->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar41->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar49 = (pIVar33->OpenPopupStack).Size;
        if ((long)iVar49 < 1) {
          if (pIVar33->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar41 != (ImGuiWindow *)0x0) && ((pIVar41->Flags & 0x5000000U) != 0x1000000)) {
              pIVar41->NavLastIds[0] = 0;
            }
            pIVar33->NavId = 0;
            pIVar33->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar33->OpenPopupStack).Data[(long)iVar49 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar49 + -1,true);
        }
      }
      else {
        if (pIVar41->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x232d,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar41->ParentWindow);
        pIVar34 = GImGui;
        pIVar47 = GImGui->NavWindow;
        if (pIVar47 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x210c,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar11 = pIVar41->ChildId;
        GImGui->NavId = IVar11;
        pIVar34->NavFocusScopeId = 0;
        pIVar47->NavLastIds[0] = IVar11;
        pIVar33->NavIdIsAlive = false;
        if (pIVar33->NavDisableMouseHover == true) {
          pIVar33->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar6 = &pIVar33->NavActivateId;
  pIVar33->NavActivateId = 0;
  pIVar33->NavActivateDownId = 0;
  pIVar33->NavActivatePressedId = 0;
  pIVar34 = GImGui;
  pIVar33->NavInputId = 0;
  IVar11 = pIVar33->NavId;
  if ((((IVar11 != 0) && (pIVar33->NavDisableHighlight == false)) &&
      (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar33->NavWindow != (ImGuiWindow *)0x0 && ((pIVar33->NavWindow->Flags & 0x40000) == 0)))) {
    fVar60 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar60) {
      auVar68 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputsDownDuration[0]),0
                          );
      bVar51 = auVar68[0] & 1;
    }
    else {
      bVar51 = 0;
    }
    IVar13 = pIVar33->ActiveId;
    if (bVar51 == 1 && IVar13 == 0) {
      *pIVar6 = IVar11;
    }
    if (IVar13 == 0) {
      if (0.0 < fVar60) goto LAB_00154657;
    }
    else if (IVar13 == IVar11 && 0.0 < fVar60) {
LAB_00154657:
      pIVar33->NavActivateDownId = IVar11;
    }
    if (IVar13 != 0) {
      bVar51 = bVar51 & IVar13 == IVar11;
    }
    if (bVar51 != 0) {
      pIVar33->NavActivatePressedId = IVar11;
    }
    if (((IVar13 == 0 || IVar13 == IVar11) &&
        (fVar60 = (pIVar34->IO).NavInputsDownDuration[2], fVar60 == 0.0)) && (!NAN(fVar60))) {
      pIVar33->NavInputId = IVar11;
    }
  }
  pIVar41 = pIVar33->NavWindow;
  if ((pIVar41 != (ImGuiWindow *)0x0) && ((pIVar41->Flags & 0x40000) != 0)) {
    pIVar33->NavDisableHighlight = true;
  }
  if ((*pIVar6 != 0) && (pIVar33->NavActivateDownId != *pIVar6)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x235b,"void ImGui::NavUpdate()");
  }
  pIVar33->NavMoveRequest = false;
  IVar11 = pIVar33->NavNextActivateId;
  if (IVar11 != 0) {
    *pIVar6 = IVar11;
    pIVar33->NavActivateDownId = IVar11;
    pIVar33->NavActivatePressedId = IVar11;
    pIVar33->NavInputId = IVar11;
  }
  pIVar33->NavNextActivateId = 0;
  if (pIVar33->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar33->NavMoveDir = -1;
    pIVar33->NavMoveRequestFlags = 0;
    if (((pIVar41 != (ImGuiWindow *)0x0) && (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar41->Flags & 0x40000) == 0)) {
      uVar40 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar40 & 1) == 0) &&
         ((fVar60 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar33->NavMoveDir = 0;
      }
      if (((uVar40 & 2) == 0) &&
         ((fVar60 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar33->NavMoveDir = 1;
      }
      if (((uVar40 & 4) == 0) &&
         ((fVar60 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar33->NavMoveDir = 2;
      }
      if (((uVar40 & 8) == 0) &&
         ((fVar60 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar60 ||
          (fVar60 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar60)))) {
        pIVar33->NavMoveDir = 3;
      }
    }
    pIVar33->NavMoveClipDir = pIVar33->NavMoveDir;
  }
  else {
    if ((pIVar33->NavMoveDir == -1) || (pIVar33->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2376,"void ImGui::NavUpdate()");
    }
    if (pIVar33->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2377,"void ImGui::NavUpdate()");
    }
    pIVar33->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar34 = GImGui;
  local_68 = 0.0;
  if (((((uVar44 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar41 = GImGui->NavWindow, pIVar41 != (ImGuiWindow *)0x0)) &&
     ((((pIVar41->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar35 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar36 = false;
    bVar37 = false;
    if (bVar35) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar35 = IsKeyDown((pIVar34->IO).KeyMap[6]);
    if (bVar35) {
      bVar36 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar35 = IsKeyPressed((pIVar34->IO).KeyMap[7],true);
    if (bVar35) {
      bVar35 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar35 = false;
    }
    bVar38 = IsKeyPressed((pIVar34->IO).KeyMap[8],true);
    if (bVar38) {
      bVar38 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar38 = false;
    }
    local_68 = 0.0;
    if ((bVar37 != bVar36) || (bVar35 != bVar38)) {
      if (((pIVar41->DC).NavLayerActiveMask == 0) && ((pIVar41->DC).NavHasScroll == true)) {
        bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[5],true);
        if (bVar36) {
          fVar60 = (pIVar41->Scroll).y - ((pIVar41->InnerRect).Max.y - (pIVar41->InnerRect).Min.y);
LAB_0015493b:
          (pIVar41->ScrollTarget).y = fVar60;
        }
        else {
          bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[6],true);
          if (bVar36) {
            fVar60 = ((pIVar41->InnerRect).Max.y - (pIVar41->InnerRect).Min.y) + (pIVar41->Scroll).y
            ;
            goto LAB_0015493b;
          }
          if (bVar35 == false) {
            if (bVar38 == false) goto LAB_0015494e;
            fVar60 = (pIVar41->ScrollMax).y;
            goto LAB_0015493b;
          }
          (pIVar41->ScrollTarget).y = 0.0;
        }
        (pIVar41->ScrollTargetCenterRatio).y = 0.0;
        (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0015494e:
        local_68 = 0.0;
      }
      else {
        IVar52 = pIVar34->NavLayer;
        pIVar50 = pIVar41->NavRectRel + IVar52;
        fVar60 = GImGui->FontBaseSize * pIVar41->FontWindowScale;
        if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
          fVar60 = fVar60 * pIVar41->ParentWindow->FontWindowScale;
        }
        auVar105._0_12_ = ZEXT812(0);
        auVar105._12_4_ = 0;
        auVar81 = ZEXT416((uint)((((pIVar41->InnerRect).Max.y - (pIVar41->InnerRect).Min.y) - fVar60
                                 ) + (pIVar41->NavRectRel[IVar52].Max.y -
                                     pIVar41->NavRectRel[IVar52].Min.y)));
        auVar68 = vcmpss_avx(auVar81,auVar105,2);
        auVar68 = vandnps_avx(auVar68,auVar81);
        bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[5],true);
        local_68 = auVar68._0_4_;
        if (bVar36) {
          local_68 = -local_68;
          pIVar34->NavMoveDir = 3;
          pIVar34->NavMoveClipDir = 2;
          pIVar34->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[6],true);
          if (!bVar36) {
            if (bVar35 == false) {
              local_68 = 0.0;
              if (bVar38 != false) {
                fVar60 = ((pIVar41->ScrollMax).y + (pIVar41->SizeFull).y) - (pIVar41->Scroll).y;
                pIVar41->NavRectRel[IVar52].Max.y = fVar60;
                pIVar41->NavRectRel[IVar52].Min.y = fVar60;
                if (pIVar41->NavRectRel[IVar52].Max.x < (pIVar50->Min).x) {
                  pIVar41->NavRectRel[IVar52].Max.x = 0.0;
                  (pIVar50->Min).x = 0.0;
                }
                pIVar34->NavMoveDir = 2;
                pIVar34->NavMoveRequestFlags = 0x50;
              }
              goto LAB_0015308a;
            }
            fVar60 = -(pIVar41->Scroll).y;
            pIVar41->NavRectRel[IVar52].Max.y = fVar60;
            pIVar41->NavRectRel[IVar52].Min.y = fVar60;
            if (pIVar41->NavRectRel[IVar52].Max.x < (pIVar50->Min).x) {
              pIVar41->NavRectRel[IVar52].Max.x = 0.0;
              (pIVar50->Min).x = 0.0;
            }
            pIVar34->NavMoveDir = 3;
            pIVar34->NavMoveRequestFlags = 0x50;
            goto LAB_0015494e;
          }
          pIVar34->NavMoveDir = 2;
          pIVar34->NavMoveClipDir = 3;
          pIVar34->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_0015308a:
  uVar44 = pIVar33->NavMoveDir;
  if (uVar44 != 0xffffffff) {
    pIVar33->NavMoveRequest = true;
    pIVar33->NavMoveRequestKeyMods = (pIVar33->IO).KeyMods;
    pIVar33->NavMoveDirLast = uVar44;
  }
  bVar35 = pIVar33->NavMoveRequest;
  if ((bVar35 == true) && (pIVar33->NavId == 0)) {
    pIVar33->NavInitRequest = true;
    pIVar33->NavInitRequestFromMove = true;
    pIVar33->NavInitResultId = 0;
    pIVar33->NavDisableHighlight = false;
  }
  pIVar34 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar3 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar3;
    if (*pbVar3 != false) goto LAB_0015311b;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0015311b:
    if (pIVar34->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2266,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar41 = pIVar33->NavWindow;
  if (((pIVar41 != (ImGuiWindow *)0x0) && ((pIVar41->Flags & 0x40000) == 0)) &&
     (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar60 = pIVar34->FontBaseSize * pIVar41->FontWindowScale;
    if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
      fVar60 = fVar60 * pIVar41->ParentWindow->FontWindowScale;
    }
    auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar60 * 100.0 * (pIVar33->IO).DeltaTime + 0.5)));
    fVar60 = auVar68._0_4_;
    if (((pIVar41->DC).NavLayerActiveMask == 0) && (((pIVar41->DC).NavHasScroll & bVar35) == 1)) {
      if (uVar44 < 2) {
        auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar60 * *(float *)(&DAT_001e4d88 +
                                                                       (ulong)(uVar44 == 0) * 4) +
                                                   (pIVar41->Scroll).x)));
        (pIVar41->ScrollTarget).x = auVar68._0_4_;
        (pIVar41->ScrollTargetCenterRatio).x = 0.0;
        (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar44 & 0xfffffffe) == 2) {
        auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar60 * *(float *)(&DAT_001e4d88 +
                                                                       (ulong)(uVar44 == 2) * 4) +
                                                   (pIVar41->Scroll).y)));
        (pIVar41->ScrollTarget).y = auVar68._0_4_;
        (pIVar41->ScrollTargetCenterRatio).y = 0.0;
        (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    auVar88._0_8_ = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    auVar88._8_56_ = extraout_var_02;
    fVar61 = auVar88._0_4_;
    if (((fVar61 != 0.0) || (NAN(fVar61))) && (pIVar41->ScrollbarX == true)) {
      auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar61 * fVar60 + (pIVar41->Scroll).x)));
      (pIVar41->ScrollTarget).x = auVar68._0_4_;
      (pIVar41->ScrollTargetCenterRatio).x = 0.0;
      (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar68 = vmovshdup_avx(auVar88._0_16_);
    fVar61 = auVar68._0_4_;
    if ((fVar61 != 0.0) || (NAN(fVar61))) {
      auVar68 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar61 * fVar60 + (pIVar41->Scroll).y)));
      (pIVar41->ScrollTarget).y = auVar68._0_4_;
      (pIVar41->ScrollTargetCenterRatio).y = 0.0;
      (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar33->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultLocal).ID = 0;
  (pIVar33->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar33->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  auVar92._8_4_ = 0x7f7fffff;
  auVar92._0_8_ = 0x7f7fffff7f7fffff;
  auVar92._12_4_ = 0x7f7fffff;
  uVar63 = vmovlps_avx(auVar92);
  (pIVar33->NavMoveResultLocal).DistBox = (float)(int)uVar63;
  (pIVar33->NavMoveResultLocal).DistCenter = (float)(int)((ulong)uVar63 >> 0x20);
  (pIVar33->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar33->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar33->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  uVar63 = vmovlps_avx(auVar92);
  (pIVar33->NavMoveResultLocalVisibleSet).DistBox = (float)(int)uVar63;
  (pIVar33->NavMoveResultLocalVisibleSet).DistCenter = (float)(int)((ulong)uVar63 >> 0x20);
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar33->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultOther).ID = 0;
  (pIVar33->NavMoveResultOther).FocusScopeId = 0;
  (pIVar33->NavMoveResultOther).DistAxial = 3.4028235e+38;
  uVar63 = vmovlps_avx(auVar92);
  (pIVar33->NavMoveResultOther).DistBox = (float)(int)uVar63;
  (pIVar33->NavMoveResultOther).DistCenter = (float)(int)((ulong)uVar63 >> 0x20);
  (pIVar33->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar35 != false) && (pIVar33->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar33->NavLayer == ImGuiNavLayer_Main)) {
    auVar74._8_8_ = 0;
    auVar74._0_4_ = (pIVar41->InnerRect).Min.x;
    auVar74._4_4_ = (pIVar41->InnerRect).Min.y;
    auVar93._8_8_ = 0;
    auVar93._0_4_ = (pIVar41->Pos).x;
    auVar93._4_4_ = (pIVar41->Pos).y;
    auVar68 = vsubps_avx(auVar74,auVar93);
    auVar75._0_4_ = auVar68._0_4_ + -1.0;
    auVar75._4_4_ = auVar68._4_4_ + -1.0;
    auVar75._8_4_ = auVar68._8_4_ + -1.0;
    auVar75._12_4_ = auVar68._12_4_ + -1.0;
    auVar108._8_8_ = 0;
    auVar108._0_4_ = (pIVar41->InnerRect).Max.x;
    auVar108._4_4_ = (pIVar41->InnerRect).Max.y;
    auVar68 = vsubps_avx(auVar108,auVar93);
    auVar94._0_4_ = auVar68._0_4_ + 1.0;
    auVar94._4_4_ = auVar68._4_4_ + 1.0;
    auVar94._8_4_ = auVar68._8_4_ + 1.0;
    auVar94._12_4_ = auVar68._12_4_ + 1.0;
    fVar60 = pIVar41->NavRectRel[0].Min.x;
    if (((fVar60 < auVar75._0_4_) ||
        (auVar68 = vmovshdup_avx(auVar75), pIVar41->NavRectRel[0].Min.y < auVar68._0_4_)) ||
       ((auVar94._0_4_ < pIVar41->NavRectRel[0].Max.x ||
        (auVar68 = vmovshdup_avx(auVar94), auVar68._0_4_ < pIVar41->NavRectRel[0].Max.y)))) {
      fVar61 = pIVar34->FontBaseSize * pIVar41->FontWindowScale;
      if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
        fVar61 = fVar61 * pIVar41->ParentWindow->FontWindowScale;
      }
      fVar61 = fVar61 * 0.5;
      auVar68 = vsubps_avx(auVar94,auVar75);
      auVar114._4_4_ = fVar61;
      auVar114._0_4_ = fVar61;
      auVar114._8_4_ = fVar61;
      auVar114._12_4_ = fVar61;
      auVar68 = vminps_avx(auVar68,auVar114);
      auVar76._0_4_ = auVar75._0_4_ + auVar68._0_4_;
      auVar76._4_4_ = auVar75._4_4_ + auVar68._4_4_;
      auVar76._8_4_ = auVar75._8_4_ + auVar68._8_4_;
      auVar76._12_4_ = auVar75._12_4_ + auVar68._12_4_;
      auVar99 = vsubps_avx(auVar94,auVar68);
      auVar81 = vinsertps_avx(ZEXT416((uint)fVar60),ZEXT416((uint)pIVar41->NavRectRel[0].Min.y),0x10
                             );
      auVar68 = vcmpps_avx(auVar81,auVar76,1);
      auVar81 = vminps_avx(auVar99,auVar81);
      auVar68 = vblendvps_avx(auVar81,auVar76,auVar68);
      auVar115._8_8_ = 0;
      auVar115._0_4_ = pIVar41->NavRectRel[0].Max.x;
      auVar115._4_4_ = pIVar41->NavRectRel[0].Max.y;
      auVar81 = vcmpps_avx(auVar115,auVar76,1);
      auVar99 = vminps_avx(auVar99,auVar115);
      auVar81 = vblendvps_avx(auVar99,auVar76,auVar81);
      IVar22 = (ImRect)vmovlhps_avx(auVar68,auVar81);
      pIVar41->NavRectRel[0] = IVar22;
      pIVar33->NavId = 0;
      pIVar33->NavFocusScopeId = 0;
    }
  }
  pIVar41 = pIVar33->NavWindow;
  fVar62 = 0.0;
  fVar90 = 0.0;
  fVar106 = 0.0;
  fVar61 = 0.0;
  fVar60 = 0.0;
  if (pIVar41 != (ImGuiWindow *)0x0) {
    IVar52 = pIVar33->NavLayer;
    fVar60 = pIVar41->NavRectRel[IVar52].Min.x;
    fVar61 = pIVar41->NavRectRel[IVar52].Min.y;
    fVar106 = pIVar41->NavRectRel[IVar52].Max.x;
    fVar90 = pIVar41->NavRectRel[IVar52].Max.y;
  }
  fVar117 = 0.0;
  fVar118 = 0.0;
  auVar68 = ZEXT816(0) << 0x40;
  if (pIVar41 != (ImGuiWindow *)0x0) {
    fVar9 = (pIVar41->Pos).x;
    fVar118 = (pIVar41->Pos).y;
    fVar117 = fVar60 + fVar9;
    fVar62 = fVar61 + fVar118;
    auVar68 = ZEXT416((uint)(fVar106 + fVar9));
    fVar118 = fVar90 + fVar118;
  }
  (pIVar33->NavScoringRect).Min.y = local_68 + fVar62;
  (pIVar33->NavScoringRect).Max.y = local_68 + fVar118;
  auVar68 = vminss_avx(ZEXT416((uint)(fVar117 + 1.0)),auVar68);
  (pIVar33->NavScoringRect).Min.x = auVar68._0_4_;
  (pIVar33->NavScoringRect).Max.x = auVar68._0_4_;
  if (local_68 + fVar118 < local_68 + fVar62) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x23c6,"void ImGui::NavUpdate()");
  }
  pIVar33->NavScoringCount = 0;
  pIVar33 = GImGui;
  pIVar7 = &(GImGui->IO).MousePos;
  bVar35 = IsMousePosValid(pIVar7);
  if (bVar35) {
    IVar64 = (pIVar33->IO).MousePos;
    auVar77._0_4_ = (int)IVar64.x;
    auVar77._4_4_ = (int)IVar64.y;
    auVar77._8_8_ = 0;
    auVar68 = vcvtdq2ps_avx(auVar77);
    IVar64 = (ImVec2)vmovlps_avx(auVar68);
    pIVar33->LastValidMousePos = IVar64;
    IVar64 = (ImVec2)vmovlps_avx(auVar68);
    (pIVar33->IO).MousePos = IVar64;
  }
  bVar35 = IsMousePosValid(pIVar7);
  if ((bVar35) && (bVar35 = IsMousePosValid(&(pIVar33->IO).MousePosPrev), bVar35)) {
    auVar78._8_8_ = 0;
    auVar78._0_4_ = (pIVar33->IO).MousePos.x;
    auVar78._4_4_ = (pIVar33->IO).MousePos.y;
    auVar95._8_8_ = 0;
    auVar95._0_4_ = (pIVar33->IO).MousePosPrev.x;
    auVar95._4_4_ = (pIVar33->IO).MousePosPrev.y;
    auVar68 = vsubps_avx(auVar78,auVar95);
    IVar64 = (ImVec2)vmovlps_avx(auVar68);
    (pIVar33->IO).MouseDelta = IVar64;
  }
  else {
    (pIVar33->IO).MouseDelta.x = 0.0;
    (pIVar33->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar33->IO).MouseDelta.x != 0.0) || (fVar60 = (pIVar33->IO).MouseDelta.y, fVar60 != 0.0))
     || (NAN(fVar60))) {
    pIVar33->NavDisableMouseHover = false;
  }
  (pIVar33->IO).MousePosPrev = (pIVar33->IO).MousePos;
  lVar55 = -5;
  do {
    fVar60 = -1.0;
    bVar35 = (pIVar33->IO).MouseDown[lVar55 + 5];
    if (bVar35 == true) {
      bVar36 = (pIVar33->IO).MouseDownDurationPrev[lVar55] < 0.0;
    }
    else {
      bVar36 = false;
    }
    (pIVar33->IO).MouseDoubleClicked[lVar55] = bVar36;
    if (bVar35 == false) {
      bVar37 = 0.0 <= (pIVar33->IO).MouseDownDurationPrev[lVar55];
    }
    else {
      bVar37 = false;
    }
    (pIVar33->IO).MouseDownOwned[lVar55] = bVar37;
    fVar61 = (pIVar33->IO).MouseDownDurationPrev[lVar55];
    (&(pIVar33->IO).MouseDragMaxDistanceAbs[0].x)[lVar55] = fVar61;
    if ((bVar35 != false) && (fVar60 = 0.0, 0.0 <= fVar61)) {
      fVar60 = fVar61 + (pIVar33->IO).DeltaTime;
    }
    (pIVar33->IO).MouseDownDurationPrev[lVar55] = fVar60;
    (pIVar33->IO).MouseReleased[lVar55] = false;
    if (bVar36 == false) {
      if (bVar35 != false) {
        bVar35 = IsMousePosValid(pIVar7);
        auVar68 = ZEXT816(0) << 0x40;
        if (bVar35) {
          auVar80._8_8_ = 0;
          auVar80._0_4_ = (pIVar33->IO).MousePos.x;
          auVar80._4_4_ = (pIVar33->IO).MousePos.y;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)((long)(pIVar33->IO).MouseClickedTime + lVar55 * 8 + -4);
          auVar68 = vsubps_avx(auVar80,auVar98);
        }
        fVar60 = auVar68._0_4_;
        auVar109._0_4_ = fVar60 * fVar60;
        auVar109._4_4_ = auVar68._4_4_ * auVar68._4_4_;
        fVar61 = auVar68._8_4_;
        auVar109._8_4_ = fVar61 * fVar61;
        fVar106 = auVar68._12_4_;
        auVar109._12_4_ = fVar106 * fVar106;
        auVar81 = vmovshdup_avx(auVar109);
        auVar99 = ZEXT416((uint)(pIVar33->IO).KeysDownDuration[lVar55]);
        auVar110 = ZEXT416((uint)(fVar60 * fVar60 + auVar81._0_4_));
        auVar81 = vcmpss_avx(auVar110,auVar99,2);
        auVar81 = vblendvps_avx(auVar110,auVar99,auVar81);
        (pIVar33->IO).KeysDownDuration[lVar55] = auVar81._0_4_;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)((pIVar33->IO).MouseDragMaxDistanceSqr + lVar55 * 2);
        auVar111._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
        auVar111._8_4_ = -fVar61;
        auVar111._12_4_ = -fVar106;
        auVar81 = vmaxps_avx(auVar111,auVar68);
        auVar68 = vcmpps_avx(auVar81,auVar100,2);
        auVar68 = vblendvps_avx(auVar81,auVar100,auVar68);
        uVar63 = vmovlps_avx(auVar68);
        *(undefined8 *)((pIVar33->IO).MouseDragMaxDistanceSqr + lVar55 * 2) = uVar63;
      }
    }
    else {
      dVar65 = pIVar33->Time;
      if ((float)(dVar65 - *(double *)((pIVar33->IO).MouseClicked + lVar55 * 8)) <
          (pIVar33->IO).MouseDoubleClickTime) {
        bVar35 = IsMousePosValid(pIVar7);
        auVar68 = ZEXT816(0) << 0x40;
        if (bVar35) {
          auVar79._8_8_ = 0;
          auVar79._0_4_ = (pIVar33->IO).MousePos.x;
          auVar79._4_4_ = (pIVar33->IO).MousePos.y;
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)((long)(pIVar33->IO).MouseClickedTime + lVar55 * 8 + -4);
          auVar68 = vsubps_avx(auVar79,auVar96);
        }
        fVar61 = auVar68._0_4_;
        auVar97._0_4_ = fVar61 * fVar61;
        auVar97._4_4_ = auVar68._4_4_ * auVar68._4_4_;
        auVar97._8_4_ = auVar68._8_4_ * auVar68._8_4_;
        auVar97._12_4_ = auVar68._12_4_ * auVar68._12_4_;
        auVar68 = vmovshdup_avx(auVar97);
        fVar60 = (pIVar33->IO).MouseDoubleClickMaxDist;
        if (fVar61 * fVar61 + auVar68._0_4_ < fVar60 * fVar60) {
          (pIVar33->IO).MouseReleased[lVar55] = true;
        }
        dVar65 = (double)((pIVar33->IO).MouseDoubleClickTime * -2.0);
      }
      *(double *)((pIVar33->IO).MouseClicked + lVar55 * 8) = dVar65;
      *(ImVec2 *)((long)(pIVar33->IO).MouseClickedTime + lVar55 * 8 + -4) = (pIVar33->IO).MousePos;
      *(bool *)((long)(pIVar33->IO).MouseDownDuration + lVar55 + -3) =
           (pIVar33->IO).MouseReleased[lVar55];
      pfVar8 = (pIVar33->IO).MouseDragMaxDistanceSqr + lVar55 * 2;
      pfVar8[0] = 0.0;
      pfVar8[1] = 0.0;
      (pIVar33->IO).KeysDownDuration[lVar55] = 0.0;
    }
    if (((pIVar33->IO).MouseDown[lVar55 + 5] == false) &&
       ((pIVar33->IO).MouseDownOwned[lVar55] == false)) {
      *(undefined1 *)((long)(pIVar33->IO).MouseDownDuration + lVar55 + -3) = 0;
    }
    if ((pIVar33->IO).MouseDoubleClicked[lVar55] == true) {
      pIVar33->NavDisableMouseHover = false;
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar41 = GetTopMostPopupModal();
  if ((pIVar41 != (ImGuiWindow *)0x0) ||
     ((pIVar32->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar32->NavWindowingHighlightAlpha)))) {
    auVar68 = vminss_avx(ZEXT416((uint)((pIVar32->IO).DeltaTime * 6.0 + pIVar32->DimBgRatio)),
                         ZEXT416(0x3f800000));
    fVar60 = auVar68._0_4_;
  }
  else {
    auVar81 = ZEXT416((uint)((pIVar32->IO).DeltaTime * -10.0 + pIVar32->DimBgRatio));
    auVar68 = vcmpss_avx(ZEXT816(0) << 0x40,auVar81,2);
    auVar68 = vandps_avx(auVar68,auVar81);
    fVar60 = auVar68._0_4_;
  }
  pIVar32->DimBgRatio = fVar60;
  pIVar32->MouseCursor = 0;
  pIVar32->WantTextInputNextFrame = -1;
  pIVar32->WantCaptureMouseNextFrame = -1;
  pIVar32->WantCaptureKeyboardNextFrame = -1;
  (pIVar32->PlatformImePos).x = 1.0;
  pIVar33 = GImGui;
  (pIVar32->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar35 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar35) &&
       (fVar60 = (pIVar33->IO).MouseDragThreshold,
       fVar61 = (pIVar33->IO).MousePos.x - (pIVar33->WheelingWindowRefMousePos).x,
       fVar106 = (pIVar33->IO).MousePos.y - (pIVar33->WheelingWindowRefMousePos).y,
       fVar60 * fVar60 < fVar61 * fVar61 + fVar106 * fVar106)) {
      pIVar33->WheelingWindowTimer = 0.0;
    }
    if (pIVar33->WheelingWindowTimer <= 0.0) {
      pIVar33->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar33->WheelingWindowTimer = 0.0;
    }
  }
  pIVar34 = GImGui;
  fVar60 = (pIVar33->IO).MouseWheel;
  if (((((fVar60 != 0.0) || (fVar61 = (pIVar33->IO).MouseWheelH, fVar61 != 0.0)) || (NAN(fVar61)))
      && ((pIVar33->ActiveId == 0 || (pIVar33->ActiveIdUsingMouseWheel == false)))) &&
     ((pIVar33->HoveredIdPreviousFrame == 0 ||
      (pIVar33->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
    pIVar41 = pIVar33->WheelingWindow;
    if (pIVar41 == (ImGuiWindow *)0x0) {
      pIVar41 = pIVar33->HoveredWindow;
    }
    if ((pIVar41 != (ImGuiWindow *)0x0) && (pIVar41->Collapsed == false)) {
      fVar61 = 0.0;
      if ((fVar60 != 0.0) || (NAN(fVar60))) {
        if (((pIVar33->IO).KeyCtrl == true) && ((pIVar33->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar41) {
            GImGui->WheelingWindow = pIVar41;
            pIVar34->WheelingWindowRefMousePos = (pIVar34->IO).MousePos;
            pIVar34->WheelingWindowTimer = 2.0;
          }
          fVar60 = pIVar41->FontWindowScale;
          auVar81 = ZEXT416((uint)((pIVar33->IO).MouseWheel * 0.1 + fVar60));
          auVar68 = vcmpss_avx(auVar81,ZEXT416(0x3f000000),1);
          auVar81 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar81);
          auVar112._8_4_ = 0x3f000000;
          auVar112._0_8_ = 0x3f0000003f000000;
          auVar112._12_4_ = 0x3f000000;
          auVar68 = vblendvps_avx(auVar81,auVar112,auVar68);
          pIVar41->FontWindowScale = auVar68._0_4_;
          if ((pIVar41->Flags & 0x1000000) == 0) {
            fVar60 = auVar68._0_4_ / fVar60;
            fVar61 = 1.0 - fVar60;
            IVar64 = pIVar41->Pos;
            auVar101._8_8_ = 0;
            auVar101._0_4_ = IVar64.x;
            auVar101._4_4_ = IVar64.y;
            IVar10 = pIVar41->Size;
            auVar113._8_8_ = 0;
            auVar113._0_4_ = IVar10.x;
            auVar113._4_4_ = IVar10.y;
            auVar116._8_8_ = 0;
            auVar116._0_4_ = (pIVar33->IO).MousePos.x;
            auVar116._4_4_ = (pIVar33->IO).MousePos.y;
            auVar68 = vsubps_avx(auVar116,auVar101);
            auVar82._0_4_ = fVar61 * IVar10.x * auVar68._0_4_;
            auVar82._4_4_ = fVar61 * IVar10.y * auVar68._4_4_;
            auVar82._8_4_ = fVar61 * 0.0 * auVar68._8_4_;
            auVar82._12_4_ = fVar61 * 0.0 * auVar68._12_4_;
            auVar68 = vdivps_avx(auVar82,auVar113);
            auVar83._0_4_ = IVar64.x + auVar68._0_4_;
            auVar83._4_4_ = IVar64.y + auVar68._4_4_;
            auVar83._8_4_ = auVar68._8_4_ + 0.0;
            auVar83._12_4_ = auVar68._12_4_ + 0.0;
            IVar64 = (ImVec2)vmovlps_avx(auVar83);
            local_40.Min = IVar64;
            SetWindowPos(pIVar41,&local_40.Min,0);
            auVar102._0_4_ = (int)(fVar60 * (pIVar41->Size).x);
            auVar102._4_4_ = (int)(fVar60 * (pIVar41->Size).y);
            auVar102._8_4_ = (int)(fVar60 * 0.0);
            auVar102._12_4_ = (int)(fVar60 * 0.0);
            auVar68 = vcvtdq2ps_avx(auVar102);
            auVar84._0_4_ = (int)(fVar60 * (pIVar41->SizeFull).x);
            auVar84._4_4_ = (int)(fVar60 * (pIVar41->SizeFull).y);
            auVar84._8_4_ = (int)(fVar60 * 0.0);
            auVar84._12_4_ = (int)(fVar60 * 0.0);
            auVar81 = vcvtdq2ps_avx(auVar84);
            auVar68 = vmovlhps_avx(auVar68,auVar81);
            (pIVar41->Size).x = (float)(int)auVar68._0_8_;
            (pIVar41->Size).y = (float)(int)((ulong)auVar68._0_8_ >> 0x20);
            (pIVar41->SizeFull).x = (float)(int)auVar68._8_8_;
            (pIVar41->SizeFull).y = (float)(int)((ulong)auVar68._8_8_ >> 0x20);
          }
          goto LAB_00153e8b;
        }
        if ((pIVar33->IO).KeyShift == false) {
          fVar61 = fVar60;
        }
      }
      if (((fVar61 != 0.0) || (NAN(fVar61))) && ((pIVar33->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar41) {
          GImGui->WheelingWindow = pIVar41;
          pIVar34->WheelingWindowRefMousePos = (pIVar34->IO).MousePos;
          pIVar34->WheelingWindowTimer = 2.0;
        }
        uVar44 = pIVar41->Flags;
        while (((uVar44 >> 0x18 & 1) != 0 &&
               (((uVar44 & 0x210) == 0x10 ||
                ((fVar60 = (pIVar41->ScrollMax).y, fVar60 == 0.0 && (!NAN(fVar60)))))))) {
          pIVar41 = pIVar41->ParentWindow;
          uVar44 = pIVar41->Flags;
        }
        if ((uVar44 & 0x210) == 0) {
          fVar60 = pIVar34->FontBaseSize * pIVar41->FontWindowScale;
          if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
            fVar60 = fVar60 * pIVar41->ParentWindow->FontWindowScale;
          }
          auVar68 = vminss_avx(ZEXT416((uint)(fVar60 * 5.0)),
                               ZEXT416((uint)(((pIVar41->InnerRect).Max.y -
                                              (pIVar41->InnerRect).Min.y) * 0.67)));
          auVar103._0_4_ = (int)auVar68._0_4_;
          auVar103._4_4_ = (int)auVar68._4_4_;
          auVar103._8_4_ = (int)auVar68._8_4_;
          auVar103._12_4_ = (int)auVar68._12_4_;
          auVar68 = vcvtdq2ps_avx(auVar103);
          (pIVar41->ScrollTarget).y = (pIVar41->Scroll).y - fVar61 * auVar68._0_4_;
          (pIVar41->ScrollTargetCenterRatio).y = 0.0;
          (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      pIVar34 = GImGui;
      fVar60 = (pIVar33->IO).MouseWheelH;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) || ((pIVar33->IO).KeyShift == true)) {
        fVar61 = (pIVar33->IO).MouseWheel;
        if (((fVar61 != 0.0) || (fVar60 = 0.0, NAN(fVar61))) &&
           (fVar60 = fVar61, (pIVar33->IO).KeyShift == false)) {
          fVar60 = 0.0;
        }
      }
      if (((fVar60 != 0.0) || (NAN(fVar60))) && ((pIVar33->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar41) {
          GImGui->WheelingWindow = pIVar41;
          pIVar34->WheelingWindowRefMousePos = (pIVar34->IO).MousePos;
          pIVar34->WheelingWindowTimer = 2.0;
        }
        while ((uVar44 = pIVar41->Flags, (uVar44 >> 0x18 & 1) != 0 &&
               (((uVar44 & 0x210) == 0x10 ||
                ((fVar61 = (pIVar41->ScrollMax).x, fVar61 == 0.0 && (!NAN(fVar61)))))))) {
          pIVar41 = pIVar41->ParentWindow;
        }
        if ((uVar44 & 0x210) == 0) {
          fVar61 = pIVar34->FontBaseSize * pIVar41->FontWindowScale;
          if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
            fVar61 = fVar61 * pIVar41->ParentWindow->FontWindowScale;
          }
          auVar68 = vminss_avx(ZEXT416((uint)(fVar61 + fVar61)),
                               ZEXT416((uint)(((pIVar41->InnerRect).Max.x -
                                              (pIVar41->InnerRect).Min.x) * 0.67)));
          auVar104._0_4_ = (int)auVar68._0_4_;
          auVar104._4_4_ = (int)auVar68._4_4_;
          auVar104._8_4_ = (int)auVar68._8_4_;
          auVar104._12_4_ = (int)auVar68._12_4_;
          auVar68 = vcvtdq2ps_avx(auVar104);
          (pIVar41->ScrollTarget).x = (pIVar41->Scroll).x - fVar60 * auVar68._0_4_;
          (pIVar41->ScrollTargetCenterRatio).x = 0.0;
          (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
LAB_00153e8b:
  pIVar33 = GImGui;
  pIVar41 = GImGui->NavWindow;
  if ((((pIVar41 == (ImGuiWindow *)0x0) || (pIVar41->Active != true)) ||
      ((pIVar41->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar49 = (GImGui->IO).KeyMap[0], iVar49 < 0)))) {
    bVar35 = false;
  }
  else {
    bVar35 = IsKeyPressed(iVar49,true);
  }
  pIVar33->FocusTabPressed = bVar35;
  if ((bVar35 != false) && (pIVar33->ActiveId == 0)) {
    pIVar33->FocusRequestNextWindow = pIVar33->NavWindow;
    pIVar33->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar33->NavId == 0) || (pIVar33->NavIdTabCounter == 0x7fffffff)) {
      iVar49 = -(uint)(pIVar33->IO).KeyShift;
    }
    else {
      iVar49 = pIVar33->NavIdTabCounter + (-(uint)(pIVar33->IO).KeyShift | 1) + 1;
    }
    pIVar33->FocusRequestNextCounterTabStop = iVar49;
  }
  pIVar33->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar33->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar33->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar41 = pIVar33->FocusRequestNextWindow;
  if (pIVar41 != (ImGuiWindow *)0x0) {
    pIVar33->FocusRequestCurrWindow = pIVar41;
    if ((pIVar33->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar49 = (pIVar41->DC).FocusCounterRegular, iVar49 != -1)) {
      pIVar33->FocusRequestCurrCounterRegular =
           (pIVar33->FocusRequestNextCounterRegular + iVar49 + 1) % (iVar49 + 1);
    }
    if ((pIVar33->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar49 = (pIVar41->DC).FocusCounterTabStop, iVar49 != -1)) {
      pIVar33->FocusRequestCurrCounterTabStop =
           (pIVar33->FocusRequestNextCounterTabStop + iVar49 + 1) % (iVar49 + 1);
    }
    pIVar33->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar33->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar33->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar33->NavIdTabCounter = 0x7fffffff;
  if ((pIVar32->WindowsFocusOrder).Size != (pIVar32->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf93,"void ImGui::NewFrame()");
  }
  local_68 = 3.4028235e+38;
  if ((pIVar32->GcCompactAll == false) &&
     (fVar60 = (pIVar32->IO).ConfigMemoryCompactTimer, 0.0 <= fVar60)) {
    local_68 = (float)pIVar32->Time - fVar60;
  }
  uVar44 = (pIVar32->Windows).Size;
  uVar42 = (ulong)uVar44;
  if (uVar44 != 0) {
    uVar59 = 0;
    do {
      if ((long)(int)uVar42 <= (long)uVar59) {
        pcVar45 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001549d6;
      }
      pIVar41 = (pIVar32->Windows).Data[uVar59];
      bVar35 = pIVar41->Active;
      pIVar41->WasActive = bVar35;
      pIVar41->BeginCount = 0;
      pIVar41->Active = false;
      pIVar41->WriteAccessed = false;
      if (((bVar35 == false) && (pIVar41->MemoryCompacted == false)) &&
         (pIVar41->LastTimeActive < local_68)) {
        GcCompactTransientWindowBuffers(pIVar41);
      }
      uVar59 = uVar59 + 1;
      uVar42 = (ulong)(uint)(pIVar32->Windows).Size;
    } while (uVar59 != uVar42);
  }
  if (0 < (pIVar32->TablesLastTimeActive).Size) {
    lVar55 = 0;
    lVar57 = 0;
    do {
      fVar60 = (pIVar32->TablesLastTimeActive).Data[lVar57];
      if ((0.0 <= fVar60) && (fVar60 < local_68)) {
        if ((pIVar32->Tables).Buf.Size <= lVar57) {
          pcVar45 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_001549d6;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar32->Tables).Buf.Data)->ID + lVar55));
      }
      lVar57 = lVar57 + 1;
      lVar55 = lVar55 + 600;
    } while (lVar57 < (pIVar32->TablesLastTimeActive).Size);
  }
  if (pIVar32->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar32->GcCompactAll = false;
  if ((pIVar32->NavWindow != (ImGuiWindow *)0x0) && (pIVar32->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar49 = (pIVar32->CurrentWindowStack).Capacity;
  if (iVar49 < 0) {
    uVar44 = iVar49 / 2 + iVar49;
    uVar42 = 0;
    if (0 < (int)uVar44) {
      uVar42 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar42 * 8,GImAllocatorUserData);
    ppIVar18 = (pIVar32->CurrentWindowStack).Data;
    if (ppIVar18 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar18,(long)(pIVar32->CurrentWindowStack).Size << 3);
      ppIVar18 = (pIVar32->CurrentWindowStack).Data;
      if ((ppIVar18 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar18,GImAllocatorUserData);
    }
    (pIVar32->CurrentWindowStack).Data = __dest_00;
    (pIVar32->CurrentWindowStack).Capacity = (int)uVar42;
  }
  (pIVar32->CurrentWindowStack).Size = 0;
  iVar49 = (pIVar32->BeginPopupStack).Capacity;
  if (iVar49 < 0) {
    uVar44 = iVar49 / 2 + iVar49;
    uVar42 = 0;
    if (0 < (int)uVar44) {
      uVar42 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar42 * 0x30,GImAllocatorUserData);
    pIVar19 = (pIVar32->BeginPopupStack).Data;
    if (pIVar19 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar19,(long)(pIVar32->BeginPopupStack).Size * 0x30);
      pIVar19 = (pIVar32->BeginPopupStack).Data;
      if ((pIVar19 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
    }
    (pIVar32->BeginPopupStack).Data = __dest_01;
    (pIVar32->BeginPopupStack).Capacity = (int)uVar42;
  }
  (pIVar32->BeginPopupStack).Size = 0;
  iVar49 = (pIVar32->ItemFlagsStack).Capacity;
  if (iVar49 < 0) {
    uVar44 = iVar49 / 2 + iVar49;
    uVar42 = 0;
    if (0 < (int)uVar44) {
      uVar42 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    piVar43 = (int *)(*GImAllocatorAllocFunc)(uVar42 * 4,GImAllocatorUserData);
    piVar20 = (pIVar32->ItemFlagsStack).Data;
    if (piVar20 != (int *)0x0) {
      memcpy(piVar43,piVar20,(long)(pIVar32->ItemFlagsStack).Size << 2);
      piVar20 = (pIVar32->ItemFlagsStack).Data;
      if ((piVar20 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar20,GImAllocatorUserData);
    }
    (pIVar32->ItemFlagsStack).Data = piVar43;
    (pIVar32->ItemFlagsStack).Capacity = (int)uVar42;
  }
  (pIVar32->ItemFlagsStack).Size = 0;
  if ((pIVar32->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    piVar43 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar20 = (pIVar32->ItemFlagsStack).Data;
    if (piVar20 != (int *)0x0) {
      memcpy(piVar43,piVar20,(long)(pIVar32->ItemFlagsStack).Size << 2);
      piVar20 = (pIVar32->ItemFlagsStack).Data;
      if ((piVar20 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar20,GImAllocatorUserData);
    }
    (pIVar32->ItemFlagsStack).Data = piVar43;
    (pIVar32->ItemFlagsStack).Capacity = 8;
  }
  (pIVar32->ItemFlagsStack).Data[(pIVar32->ItemFlagsStack).Size] = 0;
  (pIVar32->ItemFlagsStack).Size = (pIVar32->ItemFlagsStack).Size + 1;
  iVar49 = (pIVar32->GroupStack).Capacity;
  if (iVar49 < 0) {
    uVar44 = iVar49 / 2 + iVar49;
    uVar42 = 0;
    if (0 < (int)uVar44) {
      uVar42 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar42 * 0x30,GImAllocatorUserData);
    pIVar21 = (pIVar32->GroupStack).Data;
    if (pIVar21 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar21,(long)(pIVar32->GroupStack).Size * 0x30);
      pIVar21 = (pIVar32->GroupStack).Data;
      if ((pIVar21 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
    }
    (pIVar32->GroupStack).Data = __dest_02;
    (pIVar32->GroupStack).Capacity = (int)uVar42;
  }
  (pIVar32->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar32->NavWindow,false);
  pIVar33 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar33->DebugItemPickerActive == true) {
    uVar44 = pIVar33->HoveredIdPreviousFrame;
    pIVar33->MouseCursor = 7;
    iVar49 = (pIVar33->IO).KeyMap[0xe];
    if ((-1 < iVar49) && (bVar35 = IsKeyPressed(iVar49,true), bVar35)) {
      pIVar33->DebugItemPickerActive = false;
    }
    pIVar34 = GImGui;
    if (uVar44 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar33->DebugItemPickerBreakId = uVar44;
      pIVar33->DebugItemPickerActive = false;
    }
    pIVar5 = &pIVar34->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar34->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar44);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar44 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar32->WithinFrameScopeWithImplicitWindow = true;
  pIVar33 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar33->NextWindowData).SizeVal.x = 400.0;
  (pIVar33->NextWindowData).SizeVal.y = 400.0;
  (pIVar33->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar32->CurrentWindow->IsFallbackWindow != false) {
    if (0 < (pIVar32->Hooks).Size) {
      lVar55 = 0;
      lVar57 = 0;
      do {
        pIVar14 = (pIVar32->Hooks).Data;
        if (*(int *)(pIVar14 + lVar55 + 4) == 1) {
          (**(code **)(pIVar14 + lVar55 + 0x10))(pIVar32,pIVar14 + lVar55);
        }
        lVar57 = lVar57 + 1;
        lVar55 = lVar55 + 0x20;
      } while (lVar57 < (pIVar32->Hooks).Size);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfc0,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}